

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O3

ngram_model_t *
ngram_model_set_init
          (ps_config_t *config,ngram_model_t **models,char **names,float32 *weights,int32 n_models)

{
  logmath_t *lmath;
  long lVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  ulong uVar5;
  ngram_model_t *base;
  uint32 *puVar6;
  void *pvVar7;
  ngram_model_t *pnVar8;
  char *pcVar9;
  ulong uVar10;
  uint n;
  long lVar11;
  size_t n_elem;
  float64 fVar12;
  float64 fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  long lVar16;
  
  if (n_models == 0) {
    base = (ngram_model_t *)0x0;
  }
  else {
    lmath = (*models)->lmath;
    uVar5 = (ulong)(uint)n_models;
    if (1 < n_models) {
      uVar10 = 1;
      do {
        fVar12 = logmath_get_base(models[uVar10]->lmath);
        fVar13 = logmath_get_base(lmath);
        if (((double)fVar12 != (double)fVar13) || (NAN((double)fVar12) || NAN((double)fVar13))) {
LAB_0012ea06:
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                  ,0x91,"Log-math parameters don\'t match, will not create LM set\n");
          return (ngram_model_t *)0x0;
        }
        iVar3 = logmath_get_shift(models[uVar10]->lmath);
        iVar4 = logmath_get_shift(lmath);
        if (iVar3 != iVar4) goto LAB_0012ea06;
        uVar10 = uVar10 + 1;
      } while (uVar5 != uVar10);
    }
    base = (ngram_model_t *)
           __ckd_calloc__(1,0x90,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                          ,0x97);
    base[1].refcount = n_models;
    n_elem = (size_t)n_models;
    puVar6 = (uint32 *)
             __ckd_calloc__(n_elem,8,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                            ,0x9a);
    base[1].n_counts = puVar6;
    pvVar7 = __ckd_calloc__(n_elem,8,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                            ,0x9b);
    *(void **)&base[1].n_1g_alloc = pvVar7;
    pvVar7 = __ckd_calloc__(n_elem,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                            ,0x9d);
    *(void **)&base[1].n = pvVar7;
    iVar3 = logmath_log(lmath,(float64)(1.0 / (double)n_models));
    auVar2 = _DAT_00152bb0;
    if (0 < n_models) {
      lVar1 = *(long *)&base[1].n;
      lVar11 = uVar5 - 1;
      auVar14._8_4_ = (int)lVar11;
      auVar14._0_8_ = lVar11;
      auVar14._12_4_ = (int)((ulong)lVar11 >> 0x20);
      lVar11 = 0;
      auVar14 = auVar14 ^ _DAT_00152bb0;
      auVar15 = _DAT_00153ac0;
      auVar17 = _DAT_00152ba0;
      do {
        auVar18 = auVar17 ^ auVar2;
        iVar4 = auVar14._4_4_;
        if ((bool)(~(auVar18._4_4_ == iVar4 && auVar14._0_4_ < auVar18._0_4_ ||
                    iVar4 < auVar18._4_4_) & 1)) {
          *(int *)(lVar1 + lVar11) = iVar3;
        }
        if ((auVar18._12_4_ != auVar14._12_4_ || auVar18._8_4_ <= auVar14._8_4_) &&
            auVar18._12_4_ <= auVar14._12_4_) {
          *(int *)(lVar1 + 4 + lVar11) = iVar3;
        }
        auVar18 = auVar15 ^ auVar2;
        iVar19 = auVar18._4_4_;
        if (iVar19 <= iVar4 && (iVar19 != iVar4 || auVar18._0_4_ <= auVar14._0_4_)) {
          *(int *)(lVar1 + 8 + lVar11) = iVar3;
          *(int *)(lVar1 + 0xc + lVar11) = iVar3;
        }
        lVar16 = auVar17._8_8_;
        auVar17._0_8_ = auVar17._0_8_ + 4;
        auVar17._8_8_ = lVar16 + 4;
        lVar16 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 4;
        auVar15._8_8_ = lVar16 + 4;
        lVar11 = lVar11 + 0x10;
      } while ((ulong)(n_models + 3U >> 2) << 4 != lVar11);
    }
    if (weights != (float32 *)0x0) {
      *(undefined4 *)&base[1].field_0x4 = 0xffffffff;
    }
    if (n_models < 1) {
      n = 0;
    }
    else {
      uVar10 = 0;
      n = 0;
      do {
        pnVar8 = ngram_model_retain(models[uVar10]);
        *(ngram_model_t **)(base[1].n_counts + uVar10 * 2) = pnVar8;
        pcVar9 = __ckd_salloc__(names[uVar10],
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                                ,0xaa);
        *(char **)(*(long *)&base[1].n_1g_alloc + uVar10 * 8) = pcVar9;
        if (weights != (float32 *)0x0) {
          iVar3 = logmath_log(lmath,(float64)(double)(float)weights[uVar10]);
          *(int *)(*(long *)&base[1].n + uVar10 * 4) = iVar3;
        }
        if (n <= models[uVar10]->n) {
          n = (uint)models[uVar10]->n;
        }
        uVar10 = uVar10 + 1;
      } while (uVar5 != uVar10);
    }
    pvVar7 = __ckd_calloc__((long)(int)(n - 1),4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                            ,0xb2);
    *(void **)&base[1].lw = pvVar7;
    build_widmap(base,lmath,n);
  }
  return base;
}

Assistant:

ngram_model_t *
ngram_model_set_init(ps_config_t * config,
                     ngram_model_t ** models,
                     char **names, const float32 * weights, int32 n_models)
{
    ngram_model_set_t *model;
    ngram_model_t *base;
    logmath_t *lmath;
    int32 i, n;

    (void)config;
    if (n_models == 0)          /* WTF */
        return NULL;

    /* Do consistency checking on the models.  They must all use the
     * same logbase and shift. */
    lmath = models[0]->lmath;
    for (i = 1; i < n_models; ++i) {
        if (logmath_get_base(models[i]->lmath) != logmath_get_base(lmath)
            || logmath_get_shift(models[i]->lmath) !=
            logmath_get_shift(lmath)) {
            E_ERROR
                ("Log-math parameters don't match, will not create LM set\n");
            return NULL;
        }
    }

    /* Allocate the combined model, initialize it. */
    model = ckd_calloc(1, sizeof(*model));
    base = &model->base;
    model->n_models = n_models;
    model->lms = ckd_calloc(n_models, sizeof(*model->lms));
    model->names = ckd_calloc(n_models, sizeof(*model->names));
    /* Initialize weights to a uniform distribution */
    model->lweights = ckd_calloc(n_models, sizeof(*model->lweights));
    {
        int32 uniform = logmath_log(lmath, 1.0 / n_models);
        for (i = 0; i < n_models; ++i)
            model->lweights[i] = uniform;
    }
    /* Default to interpolate if weights were given. */
    if (weights)
        model->cur = -1;

    n = 0;
    for (i = 0; i < n_models; ++i) {
        model->lms[i] = ngram_model_retain(models[i]);
        model->names[i] = ckd_salloc(names[i]);
        if (weights)
            model->lweights[i] = logmath_log(lmath, weights[i]);
        /* N is the maximum of all merged models. */
        if (models[i]->n > n)
            n = models[i]->n;
    }
    /* Allocate the history mapping table. */
    model->maphist = ckd_calloc(n - 1, sizeof(*model->maphist));

    /* Now build the word-ID mapping and merged vocabulary. */
    build_widmap(base, lmath, n);
    return base;
}